

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O0

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeQuad>::TPZCompElHDivCollapsed
          (TPZCompElHDivCollapsed<pzshape::TPZShapeQuad> *this,TPZCompMesh *mesh,TPZGeoEl *gel)

{
  TPZGeoEl *this_00;
  TPZCompEl *in_RDI;
  HDivFamily in_stack_00000194;
  TPZGeoEl *in_stack_00000198;
  TPZCompMesh *in_stack_000001a0;
  void **in_stack_000001a8;
  TPZCompElHDiv<pzshape::TPZShapeQuad> *in_stack_000001b0;
  pointer_____offset_0x60___ *this_01;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZCompElHDivCollapsed<pzshape::TPZShapeQuad>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  this_01 = &VTT;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024d5188);
  TPZCompElHDiv<pzshape::TPZShapeQuad>::TPZCompElHDiv
            (in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,in_stack_00000198,
             in_stack_00000194);
  *(undefined ***)in_RDI = &PTR__TPZCompElHDivCollapsed_024d4d58;
  *(undefined ***)in_RDI = &PTR__TPZCompElHDivCollapsed_024d4d58;
  in_RDI[5].fIntegrationRule = (TPZIntPoints *)0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 6) = 0xffffffffffffffff;
  *(undefined4 *)&in_RDI[6].fMesh = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[6].fMesh + 4) = 1;
  this_00 = TPZCompEl::Reference((TPZCompEl *)this_01);
  TPZGeoEl::SetReference(this_00,in_RDI);
  return;
}

Assistant:

TPZCompElHDivCollapsed<TSHAPE>::TPZCompElHDivCollapsed(TPZCompMesh &mesh, TPZGeoEl *gel) :
TPZRegisterClassId(&TPZCompElHDivCollapsed::ClassId),
TPZCompElHDiv<TSHAPE>(mesh,gel)
{
//    fbottom_c_index = -1; set at constructor in .h
//    ftop_c_index = -1; set at constructor in .h
//    fbottom_side_orient = -1; in .h
//    ftop_side_orient = 1; in .h
    this->Reference()->SetReference(this);
    

#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	 {
         std::stringstream sout;
         sout << "Finalizando criacao do elemento ";
         this->Print(sout);
         LOGPZ_DEBUG(logger,sout.str())
	 }
#endif
	 
}